

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O3

iterator_element * __thiscall
Disa::Matrix_Sparse::lower_bound
          (iterator_element *__return_storage_ptr__,Matrix_Sparse *this,size_t *i_row,
          size_t *i_column)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  ulong *puVar4;
  ulong *i_column_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  matrix_type *local_18;
  pointer local_10;
  
  puVar1 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if ((lVar5 == 0) || (uVar7 = *i_row, (lVar5 >> 3) - 1U <= uVar7)) {
    end((Matrix_Sparse *)&stack0xffffffffffffffe8);
    i_row = (size_t *)&stack0xfffffffffffffff0;
    uVar3 = (local_18->row_non_zero).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[(long)local_10 + 1];
    lVar5 = uVar3 * 8;
    i_column_00 = (local_18->column_index).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar3;
    this = local_18;
  }
  else {
    puVar2 = (this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = puVar1[uVar7];
    i_column_00 = puVar2 + uVar3;
    uVar6 = puVar1[uVar7 + 1] - uVar3;
    if (uVar6 != 0 && (long)uVar3 <= (long)puVar1[uVar7 + 1]) {
      do {
        uVar7 = uVar6 >> 1;
        uVar6 = ~uVar7 + uVar6;
        puVar4 = i_column_00 + uVar7 + 1;
        if (*i_column <= i_column_00[uVar7]) {
          uVar6 = uVar7;
          puVar4 = i_column_00;
        }
        i_column_00 = puVar4;
      } while (0 < (long)uVar6);
    }
    lVar5 = (long)i_column_00 - (long)puVar2;
  }
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
            (__return_storage_ptr__,this,i_row,i_column_00,
             (pointer)(lVar5 + (long)(this->element_value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start));
  return __return_storage_ptr__;
}

Assistant:

Matrix_Sparse::iterator_element Matrix_Sparse::lower_bound(const std::size_t& i_row, const std::size_t& i_column) {
  if(i_row < size_row()) {
    const auto& iter_start = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row]);
    const auto& iter_end = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row + 1]);
    const auto& iter_lower = std::lower_bound(iter_start, iter_end, i_column);
    return {this, i_row, &*iter_lower, &*(element_value.begin() + std::distance(column_index.begin(), iter_lower))};
  } else return (*end()).end();
}